

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall Fossilize::FeatureFilter::Impl::validate_spirv_extension(Impl *this,string *ext)

{
  char *pcVar1;
  bool bVar2;
  size_type sVar3;
  allocator local_61;
  key_type local_60;
  anon_struct_24_3_0f70d721 *local_40;
  anon_struct_24_3_0f70d721 *mapping;
  anon_struct_24_3_0f70d721 *__end1;
  anon_struct_24_3_0f70d721 *__begin1;
  anon_struct_24_3_0f70d721 (*__range1) [86];
  string *ext_local;
  Impl *this_local;
  
  __begin1 = validate_spirv_extension::ext_mapping;
  __end1 = validate_spirv_extension::ext_mapping;
  mapping = (anon_struct_24_3_0f70d721 *)spvtools::(anonymous_namespace)::kOpSpecConstantOpcodes;
  __range1 = (anon_struct_24_3_0f70d721 (*) [86])ext;
  ext_local = (string *)this;
  while( true ) {
    if (__end1 == mapping) {
      return false;
    }
    local_40 = __end1;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __range1,__end1->spirv_ext);
    if (bVar2) break;
    __end1 = __end1 + 1;
  }
  if ((local_40->promoted_core_version != 0) &&
     (local_40->promoted_core_version <= this->api_version)) {
    return true;
  }
  pcVar1 = local_40->vulkan_ext;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
  sVar3 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&this->enabled_extensions,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (sVar3 == 0) {
    return false;
  }
  return true;
}

Assistant:

bool FeatureFilter::Impl::validate_spirv_extension(const std::string &ext) const
{
	static const struct
	{
		const char *spirv_ext;
		const char *vulkan_ext;
		uint32_t promoted_core_version;
	} ext_mapping[] = {
		// Autogenerated table.
		{ "SPV_KHR_variable_pointers", "VK_KHR_variable_pointers", VK_API_VERSION_1_1 },
		{ "SPV_AMD_shader_explicit_vertex_parameter", "VK_AMD_shader_explicit_vertex_parameter", 0 },
		{ "SPV_AMD_gcn_shader", "VK_AMD_gcn_shader", 0 },
		{ "SPV_AMD_gpu_shader_half_float", "VK_AMD_gpu_shader_half_float", 0 },
		{ "SPV_AMD_gpu_shader_int16", "VK_AMD_gpu_shader_int16", 0 },
		{ "SPV_AMD_shader_ballot", "VK_AMD_shader_ballot", 0 },
		{ "SPV_AMD_shader_fragment_mask", "VK_AMD_shader_fragment_mask", 0 },
		{ "SPV_AMD_shader_image_load_store_lod", "VK_AMD_shader_image_load_store_lod", 0 },
		{ "SPV_AMD_shader_trinary_minmax", "VK_AMD_shader_trinary_minmax", 0 },
		{ "SPV_AMD_texture_gather_bias_lod", "VK_AMD_texture_gather_bias_lod", 0 },
		{ "SPV_AMD_shader_early_and_late_fragment_tests", "VK_AMD_shader_early_and_late_fragment_tests", 0 },
		{ "SPV_KHR_shader_draw_parameters", "VK_KHR_shader_draw_parameters", VK_API_VERSION_1_1 },
		{ "SPV_KHR_8bit_storage", "VK_KHR_8bit_storage", VK_API_VERSION_1_2 },
		{ "SPV_KHR_16bit_storage", "VK_KHR_16bit_storage", VK_API_VERSION_1_1 },
		{ "SPV_KHR_shader_clock", "VK_KHR_shader_clock", 0 },
		{ "SPV_KHR_float_controls", "VK_KHR_shader_float_controls", VK_API_VERSION_1_2 },
		{ "SPV_KHR_storage_buffer_storage_class", "VK_KHR_storage_buffer_storage_class", VK_API_VERSION_1_1 },
		{ "SPV_KHR_post_depth_coverage", "VK_EXT_post_depth_coverage", 0 },
		{ "SPV_EXT_shader_stencil_export", "VK_EXT_shader_stencil_export", 0 },
		{ "SPV_KHR_shader_ballot", "VK_EXT_shader_subgroup_ballot", 0 },
		{ "SPV_KHR_subgroup_vote", "VK_EXT_shader_subgroup_vote", 0 },
		{ "SPV_NV_sample_mask_override_coverage", "VK_NV_sample_mask_override_coverage", 0 },
		{ "SPV_NV_geometry_shader_passthrough", "VK_NV_geometry_shader_passthrough", 0 },
		{ "SPV_NV_mesh_shader", "VK_NV_mesh_shader", 0 },
		{ "SPV_NV_viewport_array2", "VK_NV_viewport_array2", 0 },
		{ "SPV_NV_shader_subgroup_partitioned", "VK_NV_shader_subgroup_partitioned", 0 },
		{ "SPV_NV_shader_invocation_reorder", "VK_NV_ray_tracing_invocation_reorder", 0 },
		{ "SPV_EXT_shader_viewport_index_layer", "VK_EXT_shader_viewport_index_layer", VK_API_VERSION_1_2 },
		{ "SPV_NVX_multiview_per_view_attributes", "VK_NVX_multiview_per_view_attributes", 0 },
		{ "SPV_EXT_descriptor_indexing", "VK_EXT_descriptor_indexing", VK_API_VERSION_1_2 },
		{ "SPV_KHR_vulkan_memory_model", "VK_KHR_vulkan_memory_model", VK_API_VERSION_1_2 },
		{ "SPV_NV_compute_shader_derivatives", "VK_NV_compute_shader_derivatives", 0 },
		{ "SPV_NV_fragment_shader_barycentric", "VK_NV_fragment_shader_barycentric", 0 },
		{ "SPV_NV_shader_image_footprint", "VK_NV_shader_image_footprint", 0 },
		{ "SPV_NV_shading_rate", "VK_NV_shading_rate_image", 0 },
		{ "SPV_NV_ray_tracing", "VK_NV_ray_tracing", 0 },
		{ "SPV_KHR_ray_tracing", "VK_KHR_ray_tracing_pipeline", 0 },
		{ "SPV_KHR_ray_query", "VK_KHR_ray_query", 0 },
		{ "SPV_KHR_ray_cull_mask", "VK_KHR_ray_tracing_maintenance1", 0 },
		{ "SPV_GOOGLE_hlsl_functionality1", "VK_GOOGLE_hlsl_functionality1", 0 },
		{ "SPV_GOOGLE_user_type", "VK_GOOGLE_user_type", 0 },
		{ "SPV_GOOGLE_decorate_string", "VK_GOOGLE_decorate_string", 0 },
		{ "SPV_EXT_fragment_invocation_density", "VK_EXT_fragment_density_map", 0 },
		{ "SPV_KHR_physical_storage_buffer", "VK_KHR_buffer_device_address", VK_API_VERSION_1_2 },
		{ "SPV_EXT_physical_storage_buffer", "VK_EXT_buffer_device_address", 0 },
		{ "SPV_NV_cooperative_matrix", "VK_NV_cooperative_matrix", 0 },
		{ "SPV_NV_shader_sm_builtins", "VK_NV_shader_sm_builtins", 0 },
		{ "SPV_EXT_fragment_shader_interlock", "VK_EXT_fragment_shader_interlock", 0 },
		{ "SPV_EXT_demote_to_helper_invocation", "VK_EXT_shader_demote_to_helper_invocation", VK_API_VERSION_1_3 },
		{ "SPV_KHR_fragment_shading_rate", "VK_KHR_fragment_shading_rate", 0 },
		{ "SPV_KHR_non_semantic_info", "VK_KHR_shader_non_semantic_info", VK_API_VERSION_1_3 },
		{ "SPV_EXT_shader_image_int64", "VK_EXT_shader_image_atomic_int64", 0 },
		{ "SPV_KHR_terminate_invocation", "VK_KHR_shader_terminate_invocation", VK_API_VERSION_1_3 },
		{ "SPV_KHR_multiview", "VK_KHR_multiview", VK_API_VERSION_1_1 },
		{ "SPV_KHR_workgroup_memory_explicit_layout", "VK_KHR_workgroup_memory_explicit_layout", 0 },
		{ "SPV_EXT_shader_atomic_float_add", "VK_EXT_shader_atomic_float", 0 },
		{ "SPV_KHR_fragment_shader_barycentric", "VK_KHR_fragment_shader_barycentric", 0 },
		{ "SPV_KHR_subgroup_uniform_control_flow", "VK_KHR_shader_subgroup_uniform_control_flow", VK_API_VERSION_1_3 },
		{ "SPV_EXT_shader_atomic_float_min_max", "VK_EXT_shader_atomic_float2", 0 },
		{ "SPV_EXT_shader_atomic_float16_add", "VK_EXT_shader_atomic_float2", 0 },
		{ "SPV_NV_shader_atomic_fp16_vector", "VK_NV_shader_atomic_float16_vector", 0 },
		{ "SPV_EXT_fragment_fully_covered", "VK_EXT_conservative_rasterization", 0 },
		{ "SPV_KHR_integer_dot_product", "VK_KHR_shader_integer_dot_product", VK_API_VERSION_1_3 },
		{ "SPV_INTEL_shader_integer_functions2", "VK_INTEL_shader_integer_functions2", 0 },
		{ "SPV_KHR_device_group", "VK_KHR_device_group", VK_API_VERSION_1_1 },
		{ "SPV_QCOM_image_processing", "VK_QCOM_image_processing", 0 },
		{ "SPV_QCOM_image_processing2", "VK_QCOM_image_processing2", 0 },
		{ "SPV_EXT_mesh_shader", "VK_EXT_mesh_shader", 0 },
		{ "SPV_KHR_ray_tracing_position_fetch", "VK_KHR_ray_tracing_position_fetch", 0 },
		{ "SPV_EXT_shader_tile_image", "VK_EXT_shader_tile_image", 0 },
		{ "SPV_EXT_opacity_micromap", "VK_EXT_opacity_micromap", 0 },
		{ "SPV_KHR_cooperative_matrix", "VK_KHR_cooperative_matrix", 0 },
		{ "SPV_ARM_core_builtins", "VK_ARM_shader_core_builtins", 0 },
		{ "SPV_AMDX_shader_enqueue", "VK_AMDX_shader_enqueue", 0 },
		{ "SPV_HUAWEI_cluster_culling_shader", "VK_HUAWEI_cluster_culling_shader", 0 },
		{ "SPV_HUAWEI_subpass_shading", "VK_HUAWEI_subpass_shading", 0 },
		{ "SPV_NV_ray_tracing_motion_blur", "VK_NV_ray_tracing_motion_blur", 0 },
		{ "SPV_KHR_maximal_reconvergence", "VK_KHR_shader_maximal_reconvergence", 0 },
		{ "SPV_KHR_subgroup_rotate", "VK_KHR_shader_subgroup_rotate", 0 },
		{ "SPV_KHR_expect_assume", "VK_KHR_shader_expect_assume", 0 },
		{ "SPV_KHR_float_controls2", "VK_KHR_shader_float_controls2", 0 },
		{ "SPV_KHR_quad_control", "VK_KHR_shader_quad_control", 0 },
		{ "SPV_NV_raw_access_chains", "VK_NV_raw_access_chains", 0 },
		{ "SPV_KHR_compute_shader_derivatives", "VK_KHR_compute_shader_derivatives", 0 },
		{ "SPV_EXT_replicated_composites", "VK_EXT_shader_replicated_composites", 0 },
		{ "SPV_KHR_relaxed_extended_instruction", "VK_KHR_shader_relaxed_extended_instruction", 0 },
	};

	for (auto &mapping : ext_mapping)
	{
		if (ext == mapping.spirv_ext)
		{
			if (mapping.promoted_core_version && api_version >= mapping.promoted_core_version)
				return true;
			if (enabled_extensions.count(mapping.vulkan_ext) != 0)
				return true;
			break;
		}
	}

	return false;
}